

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O3

void __thiscall QByteArrayMatcher::QByteArrayMatcher(QByteArrayMatcher *this,QByteArray *pattern)

{
  Data *pDVar1;
  ulong uVar2;
  long lVar3;
  char cVar4;
  ulong uVar5;
  char *pcVar6;
  
  this->d = (QByteArrayMatcherPrivate *)0x0;
  pDVar1 = (pattern->d).d;
  (this->q_pattern).d.d = pDVar1;
  pcVar6 = (pattern->d).ptr;
  (this->q_pattern).d.ptr = pcVar6;
  (this->q_pattern).d.size = (pattern->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pcVar6 = (pattern->d).ptr;
  }
  if ((uchar *)pcVar6 == (uchar *)0x0) {
    pcVar6 = &QByteArray::_empty;
  }
  (this->field_2).p.p = (uchar *)pcVar6;
  uVar2 = (pattern->d).size;
  (this->field_2).p.l = uVar2;
  uVar5 = 0xff;
  if (uVar2 < 0xff) {
    uVar5 = uVar2;
  }
  memset(&this->field_2,(int)uVar5,0x100);
  if (uVar2 != 0) {
    cVar4 = (char)uVar5;
    lVar3 = 0;
    do {
      cVar4 = cVar4 + -1;
      *(char *)((long)&this->field_2 + (ulong)((uchar *)pcVar6)[lVar3 + (uVar2 - uVar5)]) = cVar4;
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != (int)uVar5);
  }
  return;
}

Assistant:

QByteArrayMatcher::QByteArrayMatcher(const QByteArray &pattern)
    : d(nullptr), q_pattern(pattern)
{
    p.p = reinterpret_cast<const uchar *>(pattern.constData());
    p.l = pattern.size();
    bm_init_skiptable(p.p, p.l, p.q_skiptable);
}